

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O3

CURLcode smtp_connect(connectdata *conn,_Bool *done)

{
  char *pcVar1;
  saslstate *sasl;
  char cVar2;
  int iVar3;
  CURLcode CVar4;
  char *pcVar5;
  size_t len;
  char *pcVar6;
  Curl_easy *data;
  char *value;
  char localhost [1025];
  char local_438 [1032];
  
  *done = false;
  Curl_conncontrol(conn,0);
  (conn->proto).ftpc.pp.response_time = 120000;
  (conn->proto).ftpc.pp.statemach_act = smtp_statemach_act;
  (conn->proto).ftpc.pp.endofresp = smtp_endofresp;
  (conn->proto).ftpc.pp.conn = conn;
  sasl = &(conn->proto).imapc.sasl.state;
  Curl_sasl_init((SASL *)sasl,&saslsmtp);
  Curl_pp_init(&(conn->proto).ftpc.pp);
  pcVar6 = conn->options;
  (conn->proto).ftpc.cwdfail = true;
  if (pcVar6 == (char *)0x0) {
LAB_00134216:
    data = conn->data;
    pcVar6 = (data->state).up.path;
    if (pcVar6[1] == '\0') {
      iVar3 = Curl_gethostname(local_438,0x401);
      pcVar6 = "localhost";
      if (iVar3 == 0) {
        pcVar6 = local_438;
      }
      data = conn->data;
    }
    else {
      pcVar6 = pcVar6 + 1;
    }
    CVar4 = Curl_urldecode(data,pcVar6,0,&(conn->proto).sshc.readdir_linkPath,(size_t *)0x0,true);
    if (CVar4 == CURLE_OK) {
      (conn->proto).imapc.state = IMAP_SERVERGREET;
      CVar4 = smtp_multi_statemach(conn,done);
    }
  }
  else {
    do {
      cVar2 = *pcVar6;
      pcVar5 = pcVar6;
      if (cVar2 == '\0') goto LAB_00134216;
      while ((value = pcVar5 + 1, cVar2 != '\0' && (cVar2 != '='))) {
        pcVar5 = value;
        cVar2 = *value;
      }
      len = 0xffffffffffffffff;
      while ((cVar2 != '\0' && (cVar2 != ';'))) {
        pcVar1 = pcVar5 + 1;
        pcVar5 = pcVar5 + 1;
        len = len + 1;
        cVar2 = *pcVar1;
      }
      iVar3 = Curl_strncasecompare(pcVar6,"AUTH=",5);
      if (iVar3 == 0) {
        return CURLE_URL_MALFORMAT;
      }
      CVar4 = Curl_sasl_parse_url_auth_option((SASL *)sasl,value,len);
      pcVar6 = pcVar5 + (*pcVar5 == ';');
    } while (CVar4 == CURLE_OK);
  }
  return CVar4;
}

Assistant:

static CURLcode smtp_connect(struct connectdata *conn, bool *done)
{
  CURLcode result = CURLE_OK;
  struct smtp_conn *smtpc = &conn->proto.smtpc;
  struct pingpong *pp = &smtpc->pp;

  *done = FALSE; /* default to not done yet */

  /* We always support persistent connections in SMTP */
  connkeep(conn, "SMTP default");

  /* Set the default response time-out */
  pp->response_time = RESP_TIMEOUT;
  pp->statemach_act = smtp_statemach_act;
  pp->endofresp = smtp_endofresp;
  pp->conn = conn;

  /* Initialize the SASL storage */
  Curl_sasl_init(&smtpc->sasl, &saslsmtp);

  /* Initialise the pingpong layer */
  Curl_pp_init(pp);

  /* Parse the URL options */
  result = smtp_parse_url_options(conn);
  if(result)
    return result;

  /* Parse the URL path */
  result = smtp_parse_url_path(conn);
  if(result)
    return result;

  /* Start off waiting for the server greeting response */
  state(conn, SMTP_SERVERGREET);

  result = smtp_multi_statemach(conn, done);

  return result;
}